

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O1

ExpandMacroResult
cmCMakePresetsGraphInternal::ExpandMacro
          (string *out,string *macroNamespace,string *macroName,MacroExpanderVector *macroExpanders,
          int version)

{
  pointer puVar1;
  MacroExpander *pMVar2;
  ExpandMacroResult EVar3;
  int iVar4;
  pointer puVar5;
  ExpandMacroResult unaff_EBP;
  bool bVar6;
  
  puVar5 = (macroExpanders->
           super__Vector_base<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (macroExpanders->
           super__Vector_base<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = puVar5 == puVar1;
  if (!bVar6) {
    EVar3 = (**((puVar5->_M_t).
                super___uniq_ptr_impl<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::MacroExpander_*,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                .super__Head_base<0UL,_cmCMakePresetsGraphInternal::MacroExpander_*,_false>.
               _M_head_impl)->_vptr_MacroExpander)();
    unaff_EBP = EVar3;
    while (unaff_EBP == Ignore) {
      puVar5 = puVar5 + 1;
      bVar6 = puVar5 == puVar1;
      unaff_EBP = EVar3;
      if (bVar6) break;
      pMVar2 = (puVar5->_M_t).
               super___uniq_ptr_impl<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::MacroExpander_*,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
               .super__Head_base<0UL,_cmCMakePresetsGraphInternal::MacroExpander_*,_false>.
               _M_head_impl;
      unaff_EBP = (**pMVar2->_vptr_MacroExpander)
                            (pMVar2,macroNamespace,macroName,out,(ulong)(uint)version);
    }
  }
  if (bVar6) {
    iVar4 = std::__cxx11::string::compare((char *)macroNamespace);
    unaff_EBP = Error - (iVar4 == 0);
  }
  return unaff_EBP;
}

Assistant:

std::string cmCMakePresetsGraph::GetFilename(const std::string& sourceDir)
{
  return cmStrCat(sourceDir, "/CMakePresets.json");
}